

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::AllocateVertex
          (ON_SubD_FixedSizeHeap *this,ON_SubDVertex *vertex0,uint edge_capacity)

{
  double dVar1;
  ON_SubDSectorSurfacePoint limit_point_00;
  bool bVar2;
  uint uVar3;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  ON_SubDFace *pOStack_d8;
  undefined1 local_d0 [8];
  ON_SubDSectorSurfacePoint limit_point;
  double crease_sector_vertex_sharpness1;
  double crease_sector_vertex_sharpness0;
  ON_SubDVertex *v1;
  double subdP [3];
  uint edge_capacity_local;
  ON_SubDVertex *vertex0_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if (vertex0 == (ON_SubDVertex *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else {
    bVar2 = ON_SubDVertex::GetSubdivisionPoint(vertex0,(double *)&v1);
    if (bVar2) {
      this_local = (ON_SubD_FixedSizeHeap *)AllocateVertex(this,(double *)&v1,edge_capacity);
      if ((ON_SubDVertex *)this_local == (ON_SubDVertex *)0x0) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0x0;
      }
      else {
        uVar3 = ON_SubDComponentBase::SubdivisionLevel(&vertex0->super_ON_SubDComponentBase);
        ON_SubDComponentBase::SetSubdivisionLevel((ON_SubDComponentBase *)this_local,uVar3 + 1);
        ((ON_SubDVertex *)this_local)->m_vertex_tag = vertex0->m_vertex_tag;
        dVar1 = ON_SubDVertex::Internal_InteriorCreaseVertexSharpnessForExperts(vertex0);
        if (1.0 < dVar1) {
          limit_point.m_sector_face = (ON_SubDFace *)ON_SubDEdgeSharpness::Sanitize(dVar1 - 1.0);
          ON_SubDVertex::Internal_SetInteriorCreaseVertexSharpnessForExperts
                    ((ON_SubDVertex *)this_local,(double)limit_point.m_sector_face,true);
        }
        bVar2 = ON_SubDVertex::SurfacePointIsSet(vertex0);
        if (((bVar2) &&
            (bVar2 = ON_SubDVertex::GetSurfacePoint
                               (vertex0,*vertex0->m_faces,(ON_SubDSectorSurfacePoint *)local_d0),
            bVar2)) && (limit_point.m_next_sector_limit_point == (ON_SubDSectorSurfacePoint *)0x0))
        {
          limit_point.m_limitN[2] = 4.94065645841247e-324;
          memcpy(&local_140,local_d0,0x70);
          limit_point_00.m_limitP[1] = (double)uStack_138;
          limit_point_00.m_limitP[0] = (double)local_140;
          limit_point_00.m_limitP[2] = (double)local_130;
          limit_point_00.m_limitT1[0] = (double)uStack_128;
          limit_point_00.m_limitT1[1] = (double)local_120;
          limit_point_00.m_limitT1[2] = (double)uStack_118;
          limit_point_00.m_limitT2[0] = (double)local_110;
          limit_point_00.m_limitT2[1] = (double)uStack_108;
          limit_point_00.m_limitT2[2] = (double)local_100;
          limit_point_00.m_limitN[0] = (double)uStack_f8;
          limit_point_00.m_limitN[1] = (double)local_f0;
          limit_point_00.m_limitN[2] = (double)uStack_e8;
          limit_point_00.m_next_sector_limit_point = (ON_SubDSectorSurfacePoint *)local_e0;
          limit_point_00.m_sector_face = pOStack_d8;
          ON_SubDVertex::SetSavedSurfacePoint((ON_SubDVertex *)this_local,true,limit_point_00);
        }
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubD_FixedSizeHeap *)0x0;
    }
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

ON_SubDVertex* ON_SubD_FixedSizeHeap::AllocateVertex(
  const ON_SubDVertex* vertex0,
  unsigned int edge_capacity
  )
{
  if ( nullptr == vertex0)
    return ON_SUBD_RETURN_ERROR(nullptr);

  double subdP[3];
  if (false == vertex0->GetSubdivisionPoint(subdP))
    return ON_SUBD_RETURN_ERROR(nullptr);
  ON_SubDVertex* v1 = AllocateVertex(subdP, edge_capacity);

  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1->SetSubdivisionLevel( vertex0->SubdivisionLevel() + 1 );

  v1->m_vertex_tag = vertex0->m_vertex_tag;

  const double crease_sector_vertex_sharpness0 = vertex0->Internal_InteriorCreaseVertexSharpnessForExperts();
  if (crease_sector_vertex_sharpness0 > 1.0)
  {
    // subdivide this value
    const double crease_sector_vertex_sharpness1 = ON_SubDEdgeSharpness::Sanitize(crease_sector_vertex_sharpness0 - 1.0);
    // The 2nd parameter is true because we have not attached the edges and faces yet.
    v1->Internal_SetInteriorCreaseVertexSharpnessForExperts(crease_sector_vertex_sharpness1, true);
  }

  if (vertex0->SurfacePointIsSet())
  {
    // copy any cached limit point from vertex0 to v1.
    ON_SubDSectorSurfacePoint limit_point;
    if (vertex0->GetSurfacePoint(vertex0->m_faces[0], limit_point))
    {
      if (nullptr == limit_point.m_sector_face)
      {
        limit_point.m_next_sector_limit_point = (const ON_SubDSectorSurfacePoint*)1;
        v1->SetSavedSurfacePoint(true, limit_point);
      }
    }
  }

  return v1;
}